

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonArrayStep(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonString *p;
  
  if ((ctx->pMem->flags & 0x2000) == 0) {
    p = (JsonString *)createAggContext(ctx,0x88);
  }
  else {
    p = (JsonString *)ctx->pMem->z;
  }
  if (p != (JsonString *)0x0) {
    if (p->zBuf == (char *)0x0) {
      p->pCtx = ctx;
      p->zBuf = p->zSpace;
      p->nAlloc = 100;
      p->nUsed = 0;
      p->bStatic = '\x01';
      p->bErr = '\0';
      jsonAppendChar(p,'[');
    }
    else {
      jsonAppendChar(p,',');
      p->pCtx = ctx;
    }
    jsonAppendValue(p,*argv);
    return;
  }
  return;
}

Assistant:

static void jsonArrayStep(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString *pStr;
  UNUSED_PARAM(argc);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, sizeof(*pStr));
  if( pStr ){
    if( pStr->zBuf==0 ){
      jsonInit(pStr, ctx);
      jsonAppendChar(pStr, '[');
    }else{
      jsonAppendChar(pStr, ',');
      pStr->pCtx = ctx;
    }
    jsonAppendValue(pStr, argv[0]);
  }
}